

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setbuf.c
# Opt level: O2

int main(void)

{
  int iVar1;
  FILE *pFVar2;
  char buffer [1025];
  
  pFVar2 = tmpfile();
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/setbuf.c, line %d - %s\n"
           ,0x26,"( fh = tmpfile() ) != NULL");
  }
  setbuf(pFVar2,buffer);
  if (pFVar2->_IO_read_ptr != buffer) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/setbuf.c, line %d - %s\n"
           ,0x28,"fh->buffer == buffer");
  }
  if (pFVar2->_IO_read_end != (char *)0x400) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/setbuf.c, line %d - %s\n"
           ,0x29,"fh->bufsize == BUFSIZ");
  }
  if (((ulong)pFVar2->_IO_buf_end & 0x700000000) != 0x100000000) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/setbuf.c, line %d - %s\n"
           ,0x2a,"( fh->status & ( _IOFBF | _IONBF | _IOLBF ) ) == _IOFBF");
  }
  iVar1 = fclose(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/setbuf.c, line %d - %s\n"
           ,0x2b,"fclose( fh ) == 0");
  }
  pFVar2 = tmpfile();
  if (pFVar2 == (FILE *)0x0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/setbuf.c, line %d - %s\n"
           ,0x2d,"( fh = tmpfile() ) != NULL");
  }
  setbuf(pFVar2,(char *)0x0);
  if (((ulong)pFVar2->_IO_buf_end & 0x700000000) != 0x400000000) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/setbuf.c, line %d - %s\n"
           ,0x2f,"( fh->status & ( _IOFBF | _IONBF | _IOLBF ) ) == _IONBF");
  }
  iVar1 = fclose(pFVar2);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/stdio/setbuf.c, line %d - %s\n"
           ,0x30,"fclose( fh ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    /* TODO: Extend testing once setvbuf() is finished. */
#ifndef REGTEST
    char buffer[ BUFSIZ + 1 ];
    FILE * fh;
    /* full buffered */
    TESTCASE( ( fh = tmpfile() ) != NULL );
    setbuf( fh, buffer );
    TESTCASE( fh->buffer == buffer );
    TESTCASE( fh->bufsize == BUFSIZ );
    TESTCASE( ( fh->status & ( _IOFBF | _IONBF | _IOLBF ) ) == _IOFBF );
    TESTCASE( fclose( fh ) == 0 );
    /* not buffered */
    TESTCASE( ( fh = tmpfile() ) != NULL );
    setbuf( fh, NULL );
    TESTCASE( ( fh->status & ( _IOFBF | _IONBF | _IOLBF ) ) == _IONBF );
    TESTCASE( fclose( fh ) == 0 );
#else
    puts( " NOTEST setbuf() test driver is PDCLib-specific." );
#endif
    return TEST_RESULTS;
}